

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void __thiscall
QMetaPropertyBuilderPrivate::QMetaPropertyBuilderPrivate
          (QMetaPropertyBuilderPrivate *this,QByteArray *_name,QByteArray *_type,QMetaType _metaType
          ,int notifierIdx,int _revision)

{
  char *type;
  
  QArrayDataPointer<char>::QArrayDataPointer((QArrayDataPointer<char> *)this,&_name->d);
  type = (_type->d).ptr;
  if (type == (char *)0x0) {
    type = &QByteArray::_empty;
  }
  QMetaObject::normalizedType(&this->type,type);
  (this->metaType).d_ptr = _metaType.d_ptr;
  this->flags = 0x4003;
  this->notifySignal = notifierIdx;
  this->revision = _revision;
  return;
}

Assistant:

QMetaPropertyBuilderPrivate
            (const QByteArray& _name, const QByteArray& _type, QMetaType _metaType, int notifierIdx=-1,
             int _revision = 0)
        : name(_name),
          type(QMetaObject::normalizedType(_type.constData())),
          metaType(_metaType),
          flags(Readable | Writable | Scriptable), notifySignal(notifierIdx),
          revision(_revision)
    {

    }